

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall
QList<QPlatformScreen::Mode>::reserve(QList<QPlatformScreen::Mode> *this,qsizetype asize)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  qreal qVar4;
  Mode *data;
  Mode *pMVar5;
  long lVar6;
  Mode *pMVar7;
  Mode *pMVar8;
  Mode *pMVar9;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     (asize <= (pDVar2->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 4))) {
    if (((pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) goto LAB_0010ba39;
    if ((pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      goto LAB_0010ba39;
    }
  }
  lVar6 = (this->d).size;
  if (asize < lVar6) {
    asize = lVar6;
  }
  local_20 = (QArrayData *)0xaaaaaaaaaaaaaaaa;
  pMVar5 = (Mode *)QArrayData::allocate(&local_20,0x10,0x10,asize,KeepSize);
  lVar6 = (this->d).size;
  if (lVar6 < 1) {
    lVar6 = 0;
  }
  else {
    pMVar8 = (this->d).ptr;
    pMVar7 = pMVar8 + lVar6;
    lVar6 = 0;
    pMVar9 = pMVar5;
    do {
      qVar4 = pMVar8->refreshRate;
      pMVar9->size = pMVar8->size;
      pMVar9->refreshRate = qVar4;
      pMVar8 = pMVar8 + 1;
      lVar6 = lVar6 + 1;
      pMVar9 = pMVar9 + 1;
    } while (pMVar8 < pMVar7);
  }
  if (local_20 != (QArrayData *)0x0) {
    *(byte *)&(local_20->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(local_20->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pQVar3 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_20;
  (this->d).ptr = pMVar5;
  (this->d).size = lVar6;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,0x10,0x10);
    }
  }
LAB_0010ba39:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}